

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

QAbstractButton * __thiscall QWizard::button(QWizard *this,WizardButton which)

{
  bool bVar1;
  QWizardPrivate *pQVar2;
  int in_ESI;
  QWizardPrivate *d;
  QWizardPrivate *in_stack_00000020;
  QAbstractButton *local_8;
  
  pQVar2 = d_func((QWizard *)0x7bbe6b);
  bVar1 = QWizardPrivate::ensureButton(in_stack_00000020,this._4_4_);
  if (bVar1) {
    local_8 = *(QAbstractButton **)((long)&pQVar2->field_20 + (long)in_ESI * 8);
  }
  else {
    local_8 = (QAbstractButton *)0x0;
  }
  return local_8;
}

Assistant:

QAbstractButton *QWizard::button(WizardButton which) const
{
    Q_D(const QWizard);
#if QT_CONFIG(style_windowsvista)
    if (d->wizStyle == AeroStyle && which == BackButton)
        return d->vistaHelper->backButton();
#endif
    if (!d->ensureButton(which))
        return nullptr;
    return d->btns[which];
}